

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

String * __thiscall
LiteScript::Character::operator+(String *__return_storage_ptr__,Character *this,String *str)

{
  char32_t *pcVar1;
  String *str_local;
  Character *this_local;
  String *res;
  
  pcVar1 = String::operator[](this->str,this->i);
  String::String(__return_storage_ptr__,*pcVar1);
  String::operator+=(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator+(const LiteScript::String& str) const {
    String res(this->str[this->i]);
    res += str;
    return res;
}